

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>_>,_4,_0>
     ::run(restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>_>
           *kernel)

{
  double dVar1;
  PointerType pdVar2;
  DstEvaluatorType *pDVar3;
  PointerType pdVar4;
  ulong uVar5;
  SrcEvaluatorType *pSVar6;
  DstXprType *pDVar7;
  ulong uVar8;
  long lVar9;
  Index row_1;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  Index col;
  long lVar16;
  Index row;
  long lVar17;
  long lVar18;
  CoeffReturnType CVar19;
  double dVar20;
  double dVar21;
  
  pDVar7 = (kernel->
           super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
           ).m_dstExpr;
  pdVar2 = (pDVar7->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
  if (((ulong)pdVar2 & 7) == 0) {
    lVar13 = (pDVar7->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value;
    if (0 < lVar13) {
      uVar5 = (pDVar7->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      lVar16 = (pDVar7->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      uVar14 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
      if ((long)uVar5 <= (long)uVar14) {
        uVar14 = uVar5;
      }
      lVar17 = 0;
      lVar15 = 0;
      do {
        if (0 < (long)uVar14) {
          pDVar3 = (kernel->
                   super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                   ).m_dst;
          pdVar4 = (pDVar3->
                   super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   ).m_data;
          lVar18 = (pDVar3->
                   super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   ).m_outerStride.m_value * lVar15;
          CVar19 = product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ::coeff(&((kernel->
                             super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                             ).m_src)->
                            super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           ,0,lVar15);
          pdVar4[lVar18] = pdVar4[lVar18] - CVar19;
        }
        uVar8 = uVar5 - uVar14 & 0xfffffffffffffffe;
        lVar18 = uVar8 + uVar14;
        if (0 < (long)uVar8) {
          lVar9 = uVar14 * 8;
          uVar8 = uVar14;
          do {
            pSVar6 = (kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                     ).m_src;
            lVar10 = (pSVar6->
                     super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     ).m_innerDim;
            if (lVar10 < 1) {
              dVar20 = 0.0;
              dVar21 = 0.0;
            }
            else {
              pdVar11 = (double *)
                        ((long)(pSVar6->
                               super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                               ).m_lhsImpl.
                               super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                               .m_data + lVar9);
              dVar20 = 0.0;
              dVar21 = 0.0;
              lVar12 = 0;
              do {
                dVar1 = *(double *)
                         ((long)(pSVar6->
                                super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                ).m_rhsImpl.
                                super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                .m_data +
                         lVar12 * 8 +
                         (pSVar6->
                         super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         ).m_rhsImpl.
                         super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_outerStride.m_value * lVar17);
                dVar20 = dVar20 + dVar1 * *pdVar11;
                dVar21 = dVar21 + dVar1 * pdVar11[1];
                lVar12 = lVar12 + 1;
                pdVar11 = pdVar11 + (pSVar6->
                                    super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                    ).m_lhsImpl.
                                    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_outerStride.m_value;
              } while (lVar10 != lVar12);
            }
            pDVar3 = (kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                     ).m_dst;
            pdVar4 = (pDVar3->
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     ).m_data;
            lVar10 = (pDVar3->
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     ).m_outerStride.m_value * lVar15;
            pdVar11 = pdVar4 + lVar10 + uVar8;
            dVar1 = pdVar11[1];
            pdVar4 = pdVar4 + lVar10 + uVar8;
            *pdVar4 = *pdVar11 - dVar20;
            pdVar4[1] = dVar1 - dVar21;
            uVar8 = uVar8 + 2;
            lVar9 = lVar9 + 0x10;
          } while ((long)uVar8 < lVar18);
        }
        for (; lVar18 < (long)uVar5; lVar18 = lVar18 + 1) {
          pDVar3 = (kernel->
                   super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                   ).m_dst;
          lVar9 = (pDVar3->
                  super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  ).m_outerStride.m_value * lVar17;
          pdVar4 = (pDVar3->
                   super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   ).m_data;
          CVar19 = product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ::coeff(&((kernel->
                             super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                             ).m_src)->
                            super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           ,lVar18,lVar15);
          *(double *)((long)pdVar4 + lVar18 * 8 + lVar9) =
               *(double *)((long)pdVar4 + lVar18 * 8 + lVar9) - CVar19;
        }
        uVar14 = (long)(uVar14 + ((uint)lVar16 & 1)) % 2;
        if ((long)uVar5 < (long)uVar14) {
          uVar14 = uVar5;
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 8;
      } while (lVar15 != lVar13);
    }
  }
  else if (0 < (pDVar7->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value) {
    lVar13 = 0;
    lVar16 = 0;
    do {
      if (0 < (pDVar7->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value) {
        lVar17 = 0;
        do {
          pDVar3 = (kernel->
                   super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                   ).m_dst;
          lVar15 = (pDVar3->
                   super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   ).m_outerStride.m_value * lVar13;
          pdVar4 = (pDVar3->
                   super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   ).m_data;
          CVar19 = product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ::coeff(&((kernel->
                             super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                             ).m_src)->
                            super_product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           ,lVar17,lVar16);
          *(double *)((long)pdVar4 + lVar17 * 8 + lVar15) =
               *(double *)((long)pdVar4 + lVar17 * 8 + lVar15) - CVar19;
          lVar17 = lVar17 + 1;
          pDVar7 = (kernel->
                   super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_1>
                   ).m_dstExpr;
        } while (lVar17 < (pDVar7->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                          ).
                          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                          .
                          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          .m_rows.m_value);
      }
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar16 < (pDVar7->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value);
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligned-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }